

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::EndGroup(void)

{
  ImGuiItemStatusFlags *pIVar1;
  ImVec2 IVar2;
  char cVar3;
  ImGuiID IVar4;
  int iVar5;
  ImGuiWindow *pIVar6;
  ImGuiGroupData *pIVar7;
  bool bVar8;
  ImGuiContext *pIVar9;
  bool bVar10;
  char cVar11;
  long lVar12;
  ImGuiID IVar13;
  bool bVar14;
  uint uVar15;
  uint uVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  ImRect local_28;
  ImVec2 local_18;
  
  pIVar9 = GImGui;
  lVar12 = (long)(GImGui->GroupStack).Size;
  if (lVar12 < 1) {
    __assert_fail("g.GroupStack.Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x216f,"void ImGui::EndGroup()");
  }
  pIVar6 = GImGui->CurrentWindow;
  pIVar7 = (GImGui->GroupStack).Data;
  if (pIVar7[lVar12 + -1].WindowID != pIVar6->ID) {
    __assert_fail("group_data.WindowID == window->ID",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.cpp"
                  ,0x2172,"void ImGui::EndGroup()");
  }
  local_28.Min = pIVar7[lVar12 + -1].BackupCursorPos;
  IVar2 = (pIVar6->DC).CursorMaxPos;
  fVar19 = pIVar7[lVar12 + -1].BackupCursorPos.x;
  fVar20 = pIVar7[lVar12 + -1].BackupCursorPos.y;
  fVar17 = IVar2.x;
  fVar18 = IVar2.y;
  uVar15 = -(uint)(fVar19 <= fVar17);
  uVar16 = -(uint)(fVar20 <= fVar18);
  local_28.Max = (ImVec2)(CONCAT44(~uVar16 & (uint)fVar20,~uVar15 & (uint)fVar19) |
                         CONCAT44((uint)fVar18 & uVar16,(uint)fVar17 & uVar15));
  (pIVar6->DC).CursorPos = local_28.Min;
  fVar19 = pIVar7[lVar12 + -1].BackupCursorMaxPos.x;
  fVar20 = pIVar7[lVar12 + -1].BackupCursorMaxPos.y;
  uVar15 = -(uint)(fVar17 <= fVar19);
  uVar16 = -(uint)(fVar18 <= fVar20);
  (pIVar6->DC).CursorMaxPos =
       (ImVec2)(CONCAT44(~uVar16 & (uint)fVar18,~uVar15 & (uint)fVar17) |
               CONCAT44((uint)fVar20 & uVar16,(uint)fVar19 & uVar15));
  (pIVar6->DC).Indent.x = pIVar7[lVar12 + -1].BackupIndent.x;
  (pIVar6->DC).GroupOffset.x = pIVar7[lVar12 + -1].BackupGroupOffset.x;
  (pIVar6->DC).CurrLineSize = pIVar7[lVar12 + -1].BackupCurrLineSize;
  fVar17 = pIVar7[lVar12 + -1].BackupCurrLineTextBaseOffset;
  (pIVar6->DC).CurrLineTextBaseOffset = fVar17;
  if (pIVar9->LogEnabled == true) {
    pIVar9->LogLinePosY = -3.4028235e+38;
  }
  if (pIVar7[lVar12 + -1].EmitItem == false) goto LAB_0014df55;
  fVar18 = (pIVar6->DC).PrevLineTextBaseOffset;
  uVar15 = -(uint)(fVar17 <= fVar18);
  (pIVar6->DC).CurrLineTextBaseOffset = (float)(~uVar15 & (uint)fVar17 | (uint)fVar18 & uVar15);
  local_18.x = local_28.Max.x - local_28.Min.x;
  local_18.y = local_28.Max.y - local_28.Min.y;
  ItemSize(&local_18,-1.0);
  ItemAdd(&local_28,0,(ImRect *)0x0,1);
  IVar4 = pIVar9->ActiveId;
  if (pIVar7[lVar12 + -1].BackupActiveIdIsAlive == IVar4) {
    if (pIVar7[lVar12 + -1].BackupActiveIdPreviousFrameIsAlive == false) {
      cVar3 = pIVar9->ActiveIdPreviousFrameIsAlive;
joined_r0x0014def3:
      if (cVar3 != '\0') {
        IVar13 = pIVar9->ActiveIdPreviousFrame;
        cVar3 = '\x01';
        bVar10 = false;
        goto LAB_0014dee7;
      }
    }
    bVar8 = false;
    cVar11 = '\0';
  }
  else {
    bVar14 = pIVar9->ActiveIdIsAlive != IVar4;
    IVar13 = IVar4;
    if (pIVar7[lVar12 + -1].BackupActiveIdPreviousFrameIsAlive == false) {
      cVar3 = pIVar9->ActiveIdPreviousFrameIsAlive;
      bVar10 = true;
      if (IVar4 == 0 || bVar14) goto joined_r0x0014def3;
    }
    else {
      cVar11 = '\0';
      bVar8 = false;
      cVar3 = '\0';
      bVar10 = true;
      if (IVar4 == 0 || bVar14) goto LAB_0014def9;
    }
LAB_0014dee7:
    bVar8 = bVar10;
    cVar11 = cVar3;
    (pIVar9->LastItemData).ID = IVar13;
  }
LAB_0014def9:
  (pIVar9->LastItemData).Rect.Min = local_28.Min;
  (pIVar9->LastItemData).Rect.Max = local_28.Max;
  if ((pIVar7[lVar12 + -1].BackupHoveredIdIsAlive == false) && (pIVar9->HoveredId != 0)) {
    pIVar1 = &(pIVar9->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 0x80;
  }
  if ((bVar8) && (pIVar9->ActiveIdHasBeenEditedThisFrame == true)) {
    pIVar1 = &(pIVar9->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 4;
  }
  uVar15 = (pIVar9->LastItemData).StatusFlags;
  (pIVar9->LastItemData).StatusFlags = uVar15 | 0x20;
  if ((cVar11 != '\0') && (IVar4 != pIVar9->ActiveIdPreviousFrame)) {
    (pIVar9->LastItemData).StatusFlags = uVar15 | 0x60;
  }
LAB_0014df55:
  iVar5 = (pIVar9->GroupStack).Size;
  if (iVar5 < 1) {
    __assert_fail("Size > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/Twinklebear[P]imgui-transfer-function/example/imgui/imgui.h"
                  ,0x717,"void ImVector<ImGuiGroupData>::pop_back() [T = ImGuiGroupData]");
  }
  (pIVar9->GroupStack).Size = iVar5 + -1;
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.GroupStack.Size > 0); // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = g.GroupStack.back();
    IM_ASSERT(group_data.WindowID == window->ID); // EndGroup() in wrong window?

    ImRect group_bb(group_data.BackupCursorPos, ImMax(window->DC.CursorMaxPos, group_data.BackupCursorPos));

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return

    if (!group_data.EmitItem)
    {
        g.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize());
    ItemAdd(group_bb, 0, NULL, ImGuiItemFlags_NoTabStop);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The two tests not the same because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = (group_data.BackupActiveIdPreviousFrameIsAlive == false) && (g.ActiveIdPreviousFrameIsAlive == true);
    if (group_contains_curr_active_id)
        g.LastItemData.ID = g.ActiveId;
    else if (group_contains_prev_active_id)
        g.LastItemData.ID = g.ActiveIdPreviousFrame;
    g.LastItemData.Rect = group_bb;

    // Forward Hovered flag
    const bool group_contains_curr_hovered_id = (group_data.BackupHoveredIdIsAlive == false) && g.HoveredId != 0;
    if (group_contains_curr_hovered_id)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredWindow;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Deactivated;

    g.GroupStack.pop_back();
    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}